

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O3

string * __thiscall
spvtools::val::(anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Decoration *decoration,Instruction *inst)

{
  ostream *poVar1;
  string *psVar2;
  Instruction *inst_00;
  ostringstream ss;
  string local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  if (*(int *)((long)this + 0x20) == -1) {
    GetIdDesc_abi_cxx11_(&local_1b8,(_anonymous_namespace_ *)decoration,inst_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (*(short *)((long)&decoration[1].params_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish + 2) != 0x1e) {
      __assert_fail("inst.opcode() == spv::Op::OpTypeStruct",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_builtins.cpp"
                    ,0x2fa,
                    "std::string spvtools::val::(anonymous namespace)::BuiltInsValidator::GetDefinitionDesc(const Decoration &, const Instruction &) const"
                   );
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Member #",8);
    std::ostream::operator<<((ostream *)local_198,*(int *)((long)this + 0x20));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," of struct ID <",0xf);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,">",1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  psVar2 = (string *)std::ios_base::~ios_base(local_128);
  return psVar2;
}

Assistant:

std::string BuiltInsValidator::GetDefinitionDesc(
    const Decoration& decoration, const Instruction& inst) const {
  std::ostringstream ss;
  if (decoration.struct_member_index() != Decoration::kInvalidMember) {
    assert(inst.opcode() == spv::Op::OpTypeStruct);
    ss << "Member #" << decoration.struct_member_index();
    ss << " of struct ID <" << inst.id() << ">";
  } else {
    ss << GetIdDesc(inst);
  }
  return ss.str();
}